

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_mask_strong_bcs(REF_GRID ref_grid,REF_DICT ref_dict,REF_BOOL *replace,REF_INT ldim)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  REF_CELL *ppRVar6;
  ulong uVar7;
  long lVar8;
  REF_BOOL *pRVar9;
  ulong uVar10;
  int cell;
  REF_INT bc;
  uint local_bc;
  REF_BOOL *local_b8;
  REF_DICT local_b0;
  REF_INT nodes [27];
  
  pRVar2 = ref_grid->node;
  lVar5 = 0;
  uVar7 = 0;
  if (0 < ldim) {
    uVar7 = (ulong)(uint)ldim;
  }
  pRVar9 = replace;
  for (; lVar5 < pRVar2->max; lVar5 = lVar5 + 1) {
    if (-1 < pRVar2->global[lVar5]) {
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        pRVar9[uVar10] = 0;
      }
    }
    pRVar9 = pRVar9 + ldim;
  }
  uVar7 = (ulong)((uint)(ldim % 5 == 0) * 5);
  if (ldim % 6 == 0) {
    uVar7 = 6;
  }
  ppRVar6 = ref_grid->cell;
  if (ref_grid->twod == 0) {
    ppRVar6 = ref_grid->cell + 3;
  }
  ref_cell = *ppRVar6;
  cell = 0;
  local_b8 = replace;
  local_b0 = ref_dict;
  do {
    if (ref_cell->max <= cell) {
      return 0;
    }
    RVar3 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar3 == 0) {
      bc = -1;
      uVar4 = ref_dict_value(local_b0,nodes[ref_cell->node_per],&bc);
      if ((uVar4 != 0) && (uVar4 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x17d,"ref_phys_mask_strong_bcs",(ulong)uVar4,"bc");
        local_bc = uVar4;
      }
      if ((uVar4 != 5) && (uVar4 != 0)) {
        return local_bc;
      }
      for (lVar5 = 0; lVar5 < ref_cell->node_per; lVar5 = lVar5 + 1) {
        if (bc == 4000) {
          iVar1 = nodes[lVar5];
          for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
            replace[uVar7 + (long)(iVar1 * ldim) + lVar8 + 1] = 1;
          }
          if (ldim % 6 == 0) {
            local_b8[(long)(iVar1 * ldim) + 0xb] = 1;
          }
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_mask_strong_bcs(REF_GRID ref_grid,
                                            REF_DICT ref_dict,
                                            REF_BOOL *replace, REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_INT first, last, i, node, bc;
  REF_INT nequ;

  nequ = 0;
  if (0 == ldim % 5) nequ = 5;
  if (0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = REF_FALSE;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node = nodes[cell_node];
      if (4000 == bc) {
        first = nequ + 1; /* first momentum */
        last = nequ + 4;  /* energy */
        for (i = first; i <= last; i++) replace[i + ldim * node] = REF_TRUE;
        if (6 == nequ) replace[nequ + 5 + ldim * node] = REF_TRUE; /* turb */
      }
    }
  }

  return REF_SUCCESS;
}